

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateTime.cpp
# Opt level: O2

WCHAR * __thiscall
PlatformAgnostic::DateTime::Utility::GetStandardName(Utility *this,size_t *nameLength,YMD *ymd)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  double tv;
  int local_30;
  bool local_29;
  int mOffset;
  bool isDST;
  
  if (ymd == (YMD *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/PlatformAgnostic/Platform/Common/DateTime.cpp"
                       ,0x3f,"(ymd != __null)","xplat needs DateTime::YMD is defined for this call")
    ;
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  tv = Js::DateUtilities::TvFromDate
                 ((double)ymd->year,(double)ymd->mon,(double)ymd->mday,(double)ymd->time);
  iVar3 = GetTZ(tv,(WCHAR *)this,&local_29,&local_30);
  (this->data).standardNameLength = (long)iVar3;
  *nameLength = (long)iVar3;
  return (WCHAR *)this;
}

Assistant:

const WCHAR *Utility::GetStandardName(size_t *nameLength, const DateTime::YMD *ymd)
    {
        AssertMsg(ymd != NULL, "xplat needs DateTime::YMD is defined for this call");
        double tv = Js::DateUtilities::TvFromDate(ymd->year, ymd->mon, ymd->mday, ymd->time);
        bool isDST;
        int mOffset;
        data.standardNameLength = GetTZ(tv, data.standardName, &isDST, &mOffset);
        *nameLength = data.standardNameLength;
        return data.standardName;
    }